

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O3

void __thiscall OpenMD::UniformField::initialize(UniformField *this)

{
  pointer pdVar1;
  Globals *pGVar2;
  pointer pdVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  vector<double,_std::allocator<double>_> local_48;
  
  pGVar2 = this->simParams;
  if ((pGVar2->ElectricField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&(pGVar2->ElectricField).data_);
    pGVar2 = this->simParams;
    pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    pdVar1 = (pointer)0x0;
    pdVar3 = (pointer)0x0;
    pdVar4 = (double *)0x0;
  }
  pdVar5 = pdVar4;
  pdVar6 = pdVar1;
  if ((pGVar2->UniformField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&(pGVar2->UniformField).data_);
    pdVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pdVar4 != (double *)0x0) &&
       (operator_delete(pdVar4,(long)pdVar1 - (long)pdVar4),
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start != (double *)0x0)) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if ((long)pdVar3 - (long)pdVar5 != 0x18) {
    snprintf(painCave.errMsg,2000,
             "UniformField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,(long)pdVar3 - (long)pdVar5 >> 3);
    painCave.isFatal = 1;
    simError();
  }
  (this->EF).super_Vector<double,_3U>.data_[0] = *pdVar5;
  (this->EF).super_Vector<double,_3U>.data_[1] = pdVar5[1];
  (this->EF).super_Vector<double,_3U>.data_[2] = pdVar5[2];
  if ((((this->super_ForceModifier).info_)->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  this->initialized = true;
  operator_delete(pdVar5,(long)pdVar6 - (long)pdVar5);
  return;
}

Assistant:

void UniformField::initialize() {
    std::vector<RealType> ef;

    if (simParams->haveElectricField()) {
      doUniformField = true;
      ef             = simParams->getElectricField();
    }
    if (simParams->haveUniformField()) {
      doUniformField = true;
      ef             = simParams->getUniformField();
    }
    if (ef.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UniformField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               ef.size());
      painCave.isFatal = 1;
      simError();
    }
    EF.x() = ef[0];
    EF.y() = ef[1];
    EF.z() = ef[2];

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }